

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

bool __thiscall CS248::Shader::linkProgram(Shader *this)

{
  initializer_list<CS248::internal::GLIntId<CS248::internal::ShaderTag>_> __l;
  bool bVar1;
  long in_RDI;
  vector<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
  shaders;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar3;
  vector<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
  *this_00;
  GLResourceManager *this_01;
  undefined4 in_stack_ffffffffffffffe0;
  ProgramId in_stack_ffffffffffffffe4;
  
  uVar2 = *(undefined4 *)(in_RDI + 0x48);
  uVar3 = *(undefined4 *)(in_RDI + 0x4c);
  this_00 = (vector<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
             *)&stack0xffffffffffffffc8;
  this_01 = (GLResourceManager *)0x2;
  std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>::allocator
            ((allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_> *)0x1c5953);
  __l._M_len._0_4_ = in_stack_ffffffffffffffe0;
  __l._M_array = (iterator)this_01;
  __l._M_len._4_4_ = in_stack_ffffffffffffffe4.id;
  std::
  vector<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
  ::vector(this_00,__l,(allocator_type *)CONCAT44(uVar3,uVar2));
  std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>::~allocator
            ((allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_> *)0x1c5978);
  uVar2 = *(undefined4 *)(in_RDI + 0x50);
  bVar1 = GLResourceManager::attachShadersAndLinkProgram(this_01,in_stack_ffffffffffffffe4,this_00);
  std::
  vector<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
  ::~vector((vector<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
             *)CONCAT44(in_stack_ffffffffffffffb4,uVar2));
  return bVar1;
}

Assistant:

bool Shader::linkProgram() {
  std::vector<ShaderId> shaders = {vertexShaderId_, fragmentShaderId_};
  return gl_mgr_->attachShadersAndLinkProgram(programId_, shaders);
}